

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fnmatch.cc
# Opt level: O2

bool absl::lts_20240722::log_internal::FNMatch(string_view pattern,string_view str)

{
  char cVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  string_view pattern_local;
  string_view str_local;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  str_local._M_str = str._M_str;
  str_local._M_len = str._M_len;
  bVar2 = false;
  pattern_local._M_len = pattern._M_len;
  pattern_local._M_str = pattern._M_str;
  do {
    while( true ) {
      while( true ) {
        sVar4 = pattern_local._M_len - 1;
        if (sVar4 == 0xffffffffffffffff) {
          return (bool)(bVar2 | str_local._M_len == 0);
        }
        if (str_local._M_len == 0) {
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                            (&pattern_local,'*',0);
          return sVar3 == 0xffffffffffffffff;
        }
        cVar1 = *pattern_local._M_str;
        if (cVar1 != '*') break;
        bVar2 = true;
        pattern_local._M_len = sVar4;
        pattern_local._M_str = pattern_local._M_str + 1;
      }
      if (cVar1 != '?') break;
LAB_0010128d:
      str_local._M_str = str_local._M_str + 1;
      str_local._M_len = str_local._M_len - 1;
      pattern_local._M_len = sVar4;
      pattern_local._M_str = pattern_local._M_str + 1;
    }
    if (!bVar2) {
      if (cVar1 != *str_local._M_str) {
        return false;
      }
      goto LAB_0010128d;
    }
    local_28._M_str = pattern_local._M_str;
    local_28._M_len = pattern_local._M_len;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(&local_28,"*?",0);
    if (sVar3 != 0xffffffffffffffff) {
      local_28 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_28,0,sVar3);
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&str_local,local_28._M_str,0,local_28._M_len);
    if (sVar3 == 0xffffffffffffffff) {
      return false;
    }
    str_local._M_str = str_local._M_str + sVar3 + local_28._M_len;
    str_local._M_len = str_local._M_len - (sVar3 + local_28._M_len);
    bVar2 = false;
    pattern_local._M_len = pattern_local._M_len - local_28._M_len;
    pattern_local._M_str = pattern_local._M_str + local_28._M_len;
  } while( true );
}

Assistant:

bool FNMatch(absl::string_view pattern, absl::string_view str) {
  bool in_wildcard_match = false;
  while (true) {
    if (pattern.empty()) {
      // `pattern` is exhausted; succeed if all of `str` was consumed matching
      // it.
      return in_wildcard_match || str.empty();
    }
    if (str.empty()) {
      // `str` is exhausted; succeed if `pattern` is empty or all '*'s.
      return pattern.find_first_not_of('*') == pattern.npos;
    }
    switch (pattern.front()) {
      case '*':
        pattern.remove_prefix(1);
        in_wildcard_match = true;
        break;
      case '?':
        pattern.remove_prefix(1);
        str.remove_prefix(1);
        break;
      default:
        if (in_wildcard_match) {
          absl::string_view fixed_portion = pattern;
          const size_t end = fixed_portion.find_first_of("*?");
          if (end != fixed_portion.npos) {
            fixed_portion = fixed_portion.substr(0, end);
          }
          const size_t match = str.find(fixed_portion);
          if (match == str.npos) {
            return false;
          }
          pattern.remove_prefix(fixed_portion.size());
          str.remove_prefix(match + fixed_portion.size());
          in_wildcard_match = false;
        } else {
          if (pattern.front() != str.front()) {
            return false;
          }
          pattern.remove_prefix(1);
          str.remove_prefix(1);
        }
        break;
    }
  }
}